

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

wstring * __thiscall
mjs::cpp_quote_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,wstring_view *s)

{
  long lVar1;
  long lVar2;
  long lVar3;
  wchar_t wVar4;
  uint uVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  lVar1 = *(long *)this;
  if (lVar1 != 0) {
    lVar2 = *(long *)(this + 8);
    lVar3 = 0;
    do {
      uVar5 = *(uint *)(lVar2 + lVar3);
      wVar4 = (wchar_t)__return_storage_ptr__;
      if (((uVar5 - 0x80 < 0xffffffa0) || (uVar5 == 0x5c)) || (uVar5 == 0x22)) {
        uVar5 = uVar5 & 0xffff;
        if (uVar5 < 0x22) {
          switch(uVar5) {
          case 8:
            break;
          case 9:
            break;
          case 10:
            break;
          default:
switchD_0016f46b_caseD_b:
            std::__cxx11::wstring::push_back(wVar4);
            if (uVar5 < 0x100) {
              std::__cxx11::wstring::push_back(wVar4);
            }
            else {
              std::__cxx11::wstring::push_back(wVar4);
              std::__cxx11::wstring::push_back(wVar4);
              std::__cxx11::wstring::push_back(wVar4);
            }
            std::__cxx11::wstring::push_back(wVar4);
            goto LAB_0016f56b;
          case 0xc:
            break;
          case 0xd:
          }
        }
        else if (((uVar5 != 0x5c) && (uVar5 != 0x27)) && (uVar5 != 0x22))
        goto switchD_0016f46b_caseD_b;
        std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__);
      }
      else {
LAB_0016f56b:
        std::__cxx11::wstring::push_back(wVar4);
      }
      lVar3 = lVar3 + 4;
    } while (lVar1 << 2 != lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring cpp_quote(const std::wstring_view& s) {
    std::wstring r;
    for (const auto c: s) {
        if (c < 32 || c > 127 || c == '\"' || c == '\\') {
            cpp_quote_escape(r, c);
        } else {
            r += c;
        }
    }
    return r;
}